

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

int require_function_datatype(Context_conflict *ctx,MOJOSHADER_astDataType *datatype)

{
  MOJOSHADER_astDataType *pMVar1;
  int iVar2;
  
  pMVar1 = reduce_datatype(ctx,datatype);
  if ((pMVar1 == (MOJOSHADER_astDataType *)0x0) ||
     (iVar2 = 1, pMVar1->type != MOJOSHADER_AST_DATATYPE_FUNCTION)) {
    iVar2 = 0;
    failf(ctx,"%s","expected function");
  }
  return iVar2;
}

Assistant:

static int require_function_datatype(Context *ctx,
                                     const MOJOSHADER_astDataType *datatype)
{
    datatype = reduce_datatype(ctx, datatype);
    if ((!datatype) || (datatype->type != MOJOSHADER_AST_DATATYPE_FUNCTION))
    {
        fail(ctx, "expected function");
        return 0;
    } // if

    return 1;
}